

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O2

VkDeviceSize
vkt::memory::anon_unknown_0::randomSize(Random *rng,VkDeviceSize atomSize,VkDeviceSize maxSize)

{
  deUint64 dVar1;
  
  if (1 < maxSize / atomSize) {
    dVar1 = de::Random::getUint64(rng);
    atomSize = atomSize * (dVar1 % (maxSize / atomSize) + 1);
  }
  return atomSize;
}

Assistant:

VkDeviceSize randomSize (de::Random& rng, VkDeviceSize atomSize, VkDeviceSize maxSize)
{
	const VkDeviceSize maxSizeInAtoms = maxSize / atomSize;

	DE_ASSERT(maxSizeInAtoms > 0);

	return maxSizeInAtoms > 1
			? atomSize * (1 + (VkDeviceSize)(rng.getUint64() % (deUint64)maxSizeInAtoms))
			: atomSize;
}